

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewBase.hpp
# Opt level: O2

void __thiscall
Diligent::TextureViewBase<Diligent::EngineGLImplTraits>::TextureViewBase
          (TextureViewBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,TextureViewDesc *ViewDesc,ITexture *pTexture,
          bool bIsDefaultView,bool bIsDeviceInternal)

{
  ITexture *pObj;
  undefined3 in_register_00000089;
  
  DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                     ,pRefCounters,pDevice,ViewDesc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
  ).super_ObjectBase<Diligent::ITextureViewGL>.super_RefCountedObject<Diligent::ITextureViewGL>.
  super_ITextureViewGL.super_ITextureView.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00a58ae8;
  (this->m_pSampler).m_pObject = (ISampler *)0x0;
  this->m_pTexture = pTexture;
  pObj = (ITexture *)0x0;
  if (CONCAT31(in_register_00000089,bIsDefaultView) == 0) {
    pObj = pTexture;
  }
  RefCntAutoPtr<Diligent::ITexture>::RefCntAutoPtr(&this->m_spTexture,pObj);
  return;
}

Assistant:

TextureViewBase(IReferenceCounters*    pRefCounters,
                    RenderDeviceImplType*  pDevice,
                    const TextureViewDesc& ViewDesc,
                    ITexture*              pTexture,
                    bool                   bIsDefaultView,
                    bool                   bIsDeviceInternal = false) :
        // Default views are created as part of the texture, so we cannot not keep strong
        // reference to the texture to avoid cyclic links. Instead, we will attach to the
        // reference counters of the texture.
        TDeviceObjectBase(pRefCounters, pDevice, ViewDesc, bIsDeviceInternal),
        m_pTexture(pTexture),
        // For non-default view, we will keep strong reference to texture
        m_spTexture(bIsDefaultView ? nullptr : pTexture)
    {}